

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

RepeatedField<long> * __thiscall
google::protobuf::RepeatedField<long>::operator=
          (RepeatedField<long> *this,RepeatedField<long> *other)

{
  void *pvVar1;
  long *plVar2;
  void **ppvVar3;
  
  if (this != other) {
    if (this->total_size_ == 0) {
      ppvVar3 = &this->arena_or_elements_;
    }
    else {
      plVar2 = elements(this);
      ppvVar3 = (void **)(plVar2 + -1);
    }
    pvVar1 = *ppvVar3;
    if (other->total_size_ == 0) {
      ppvVar3 = &other->arena_or_elements_;
    }
    else {
      plVar2 = elements(other);
      ppvVar3 = (void **)(plVar2 + -1);
    }
    if (pvVar1 == *ppvVar3) {
      InternalSwap(this,other);
    }
    else {
      this->current_size_ = 0;
      MergeFrom(this,other);
    }
  }
  return this;
}

Assistant:

inline RepeatedField<Element>& RepeatedField<Element>::operator=(
    RepeatedField&& other) noexcept {
  // We don't just call Swap(&other) here because it would perform 3 copies if
  // the two fields are on different arenas.
  if (this != &other) {
    if (this->GetArena() != other.GetArena()) {
      CopyFrom(other);
    } else {
      InternalSwap(&other);
    }
  }
  return *this;
}